

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O0

void adlib_write(void *chip,Bit16u idx,Bit8u val)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  Bitu BVar4;
  Bitu BVar5;
  uint uVar6;
  op_type_conflict *poVar7;
  int iVar8;
  Bitu local_124;
  uint local_120;
  uint local_11c;
  uint local_110;
  uint local_10c;
  uint local_100;
  uint local_fc;
  uint local_ec;
  Bitu local_e0;
  uint local_dc;
  Bitu local_d8;
  uint local_d4;
  op_type_conflict *op_ptr_4;
  Bits wselbase;
  Bitu base_7;
  int num_4;
  Bitu chanbase_4;
  Bits opbase_2;
  Bitu base_6;
  Bitu chanbase_3;
  Bits modbase_1;
  Bits opbase_1;
  Bitu base_5;
  Bitu chanbase_2;
  Bits modbase;
  Bits opbase;
  Bitu base_4;
  op_type_conflict *op_ptr_3;
  Bitu regbase_3;
  Bitu base_3;
  int num_3;
  op_type_conflict *op_ptr_2;
  Bitu regbase_2;
  Bitu base_2;
  int num_2;
  Bitu regbase_1;
  op_type_conflict *op_ptr_1;
  Bitu chanbase_1;
  Bitu modop_1;
  Bitu base_1;
  int num_1;
  op_type_conflict *op_ptr;
  Bitu chanbase;
  Bitu regbase;
  Bitu modop;
  Bitu base;
  int num;
  Bit16u second_set;
  OPL_DATA_conflict *OPL;
  Bit8u val_local;
  Bit16u idx_local;
  void *chip_local;
  
  uVar1 = idx & 0x100;
  *(Bit8u *)((long)chip + (ulong)idx + 0x1b2c) = val;
  uVar2 = idx & 0xf0;
  if ((idx & 0xf0) == 0) {
    uVar6 = (uint)idx;
    if (1 < uVar6 - 2) {
      if (uVar6 == 4) {
        if ((val & 0x80) == 0) {
          *(undefined1 *)((long)chip + 0x1b29) = 0;
        }
        else {
          *(byte *)((long)chip + 0x1b29) = *(byte *)((long)chip + 0x1b29) & 0x9f;
        }
      }
      else if ((uVar6 != 8) && (uVar6 == 0x104)) {
        *(bool *)((long)chip + 0xb8) = (val & 1) != 0 && -1 < (int)(val & 1);
        *(byte *)((long)chip + 0x2f9) = *(byte *)((long)chip + 0xb8) & 1;
        *(bool *)((long)chip + 0x178) = (val & 2) != 0 && -1 < (int)(val & 2);
        *(byte *)((long)chip + 0x3b9) = *(byte *)((long)chip + 0x178) & 1;
        *(bool *)((long)chip + 0x238) = (val & 4) != 0 && -1 < (int)(val & 4);
        *(byte *)((long)chip + 0x479) = *(byte *)((long)chip + 0x238) & 1;
        *(bool *)((long)chip + 0xe38) = (val & 8) != 0 && -1 < (int)(val & 8);
        *(byte *)((long)chip + 0x1079) = *(byte *)((long)chip + 0xe38) & 1;
        *(bool *)((long)chip + 0xef8) = (val & 0x10) != 0 && -1 < (int)(val & 0x10);
        *(byte *)((long)chip + 0x1139) = *(byte *)((long)chip + 0xef8) & 1;
        *(bool *)((long)chip + 0xfb8) = (val & 0x20) != 0 && -1 < (int)(val & 0x20);
        *(byte *)((long)chip + 0x11f9) = *(byte *)((long)chip + 0xfb8) & 1;
      }
    }
  }
  else if ((uVar2 == 0x20) || (uVar2 == 0x30)) {
    uVar6 = idx - 0x20 & 0xff;
    if (((idx & 7) < 6) && (uVar6 < 0x16)) {
      local_d4 = uVar6;
      if (uVar1 != 0) {
        local_d4 = uVar6 + 0x16;
      }
      uVar3 = (uint)""[local_d4];
      BVar4 = uVar6 + uVar1;
      local_d8 = uVar3;
      if (uVar1 != 0) {
        local_d8 = uVar3 + 0xee;
      }
      iVar8 = 9;
      if ((idx & 7) < 3) {
        iVar8 = 0;
      }
      poVar7 = (op_type_conflict *)((long)chip + (ulong)(uVar3 + iVar8) * 0xc0 + 8);
      change_keepsustain((OPL_DATA_conflict *)chip,BVar4,poVar7);
      change_vibrato((OPL_DATA_conflict *)chip,BVar4,poVar7);
      if (((*(byte *)((long)chip + 0x1c31) & 1) == 0) ||
         ((*(byte *)((long)chip + (ulong)uVar3 * 0xc0 + 0xb9) & 1) == 0)) {
        change_frequency((OPL_DATA_conflict *)chip,local_d8,BVar4,poVar7);
      }
      else {
        change_frequency((OPL_DATA_conflict *)chip,local_d8 - 3,BVar4,poVar7);
      }
    }
  }
  else if ((uVar2 == 0x40) || (uVar2 == 0x50)) {
    uVar6 = idx - 0x40 & 0xff;
    if (((idx & 7) < 6) && (uVar6 < 0x16)) {
      local_dc = uVar6;
      if (uVar1 != 0) {
        local_dc = uVar6 + 0x16;
      }
      uVar3 = (uint)""[local_dc];
      local_e0 = uVar3;
      if (uVar1 != 0) {
        local_e0 = uVar3 + 0xee;
      }
      iVar8 = 9;
      if ((idx & 7) < 3) {
        iVar8 = 0;
      }
      poVar7 = (op_type_conflict *)((long)chip + (ulong)(uVar3 + iVar8) * 0xc0 + 8);
      if (((*(byte *)((long)chip + 0x1c31) & 1) == 0) ||
         ((*(byte *)((long)chip + (ulong)uVar3 * 0xc0 + 0xb9) & 1) == 0)) {
        change_frequency((OPL_DATA_conflict *)chip,local_e0,uVar6 + uVar1,poVar7);
      }
      else {
        change_frequency((OPL_DATA_conflict *)chip,local_e0 - 3,uVar6 + uVar1,poVar7);
      }
    }
  }
  else if ((uVar2 == 0x60) || (uVar2 == 0x70)) {
    local_ec = idx - 0x60 & 0xff;
    if (((idx & 7) < 6) && (local_ec < 0x16)) {
      BVar4 = local_ec + uVar1;
      if (uVar1 != 0) {
        local_ec = local_ec + 0x16;
      }
      poVar7 = (op_type_conflict *)((long)chip + (ulong)""[local_ec] * 0xc0 + 8);
      change_attackrate((OPL_DATA_conflict *)chip,BVar4,poVar7);
      change_decayrate((OPL_DATA_conflict *)chip,BVar4,poVar7);
    }
  }
  else if ((uVar2 == 0x80) || (uVar2 == 0x90)) {
    local_fc = idx - 0x80 & 0xff;
    if (((idx & 7) < 6) && (local_fc < 0x16)) {
      BVar4 = local_fc + uVar1;
      if (uVar1 != 0) {
        local_fc = local_fc + 0x16;
      }
      poVar7 = (op_type_conflict *)((long)chip + (ulong)""[local_fc] * 0xc0 + 8);
      change_releaserate((OPL_DATA_conflict *)chip,BVar4,poVar7);
      change_sustainlevel((OPL_DATA_conflict *)chip,BVar4,poVar7);
    }
  }
  else if (uVar2 == 0xa0) {
    local_10c = idx - 0xa0 & 0xff;
    if (local_10c < 9) {
      local_100 = local_10c;
      if (uVar1 != 0) {
        local_100 = local_10c + 0x12;
      }
      if (((*(byte *)((long)chip + 0x1c31) & 1) == 0) ||
         ((*(byte *)((long)chip + (long)(int)local_100 * 0xc0 + 0xb9) & 1) == 0)) {
        BVar4 = (uint)""[local_10c] + (uint)uVar1;
        BVar5 = local_10c + uVar1;
        change_frequency((OPL_DATA_conflict *)chip,BVar5,BVar4,
                         (op_type_conflict *)((long)chip + (long)(int)local_100 * 0xc0 + 8));
        change_frequency((OPL_DATA_conflict *)chip,BVar5,BVar4 + 3,
                         (op_type_conflict *)((long)chip + (long)(int)(local_100 + 9) * 0xc0 + 8));
        if ((*(byte *)((long)chip + 0x1c31) & 1) != 0) {
          if (uVar1 != 0) {
            local_10c = local_10c + 0x12;
          }
          if ((*(byte *)((long)chip + (ulong)local_10c * 0xc0 + 0xb8) & 1) != 0) {
            change_frequency((OPL_DATA_conflict *)chip,BVar5,BVar4 + 8,
                             (op_type_conflict *)
                             ((long)chip + (long)(int)(local_100 + 3) * 0xc0 + 8));
            change_frequency((OPL_DATA_conflict *)chip,BVar5,BVar4 + 0xb,
                             (op_type_conflict *)
                             ((long)chip + (long)(int)(local_100 + 0xc) * 0xc0 + 8));
          }
        }
      }
    }
  }
  else if (uVar2 == 0xb0) {
    if (*(long *)((long)chip + 0x1df8) != 0) {
      (**(code **)((long)chip + 0x1df8))(*(undefined8 *)((long)chip + 0x1e00));
    }
    if (idx == 0xbd) {
      if (uVar1 == 0) {
        if (((val & 0x20) != 0) && ((val & 0x1f) != 0)) {
          *(undefined1 *)((long)chip + 0x1b28) = 0;
        }
        if ((val & 0x30) == 0x30) {
          enable_operator((OPL_DATA_conflict *)chip,0x10,(op_type_conflict *)((long)chip + 0x488),2)
          ;
          change_frequency((OPL_DATA_conflict *)chip,6,0x10,(op_type_conflict *)((long)chip + 0x488)
                          );
          enable_operator((OPL_DATA_conflict *)chip,0x13,(op_type_conflict *)((long)chip + 0xb48),2)
          ;
          change_frequency((OPL_DATA_conflict *)chip,6,0x13,(op_type_conflict *)((long)chip + 0xb48)
                          );
        }
        else {
          disable_operator((op_type_conflict *)((long)chip + 0x488),2);
          disable_operator((op_type_conflict *)((long)chip + 0xb48),2);
        }
        if ((val & 0x28) == 0x28) {
          enable_operator((OPL_DATA_conflict *)chip,0x14,(op_type_conflict *)((long)chip + 0xc08),2)
          ;
          change_frequency((OPL_DATA_conflict *)chip,7,0x14,(op_type_conflict *)((long)chip + 0xc08)
                          );
        }
        else {
          disable_operator((op_type_conflict *)((long)chip + 0xc08),2);
        }
        if ((val & 0x24) == 0x24) {
          enable_operator((OPL_DATA_conflict *)chip,0x12,(op_type_conflict *)((long)chip + 0x608),2)
          ;
          change_frequency((OPL_DATA_conflict *)chip,8,0x12,(op_type_conflict *)((long)chip + 0x608)
                          );
        }
        else {
          disable_operator((op_type_conflict *)((long)chip + 0x608),2);
        }
        if ((val & 0x22) == 0x22) {
          enable_operator((OPL_DATA_conflict *)chip,0x15,(op_type_conflict *)((long)chip + 0xcc8),2)
          ;
          change_frequency((OPL_DATA_conflict *)chip,8,0x15,(op_type_conflict *)((long)chip + 0xcc8)
                          );
        }
        else {
          disable_operator((op_type_conflict *)((long)chip + 0xcc8),2);
        }
        if ((val & 0x21) == 0x21) {
          enable_operator((OPL_DATA_conflict *)chip,0x11,(op_type_conflict *)((long)chip + 0x548),2)
          ;
          change_frequency((OPL_DATA_conflict *)chip,7,0x11,(op_type_conflict *)((long)chip + 0x548)
                          );
        }
        else {
          disable_operator((op_type_conflict *)((long)chip + 0x548),2);
        }
      }
    }
    else {
      local_11c = idx - 0xb0 & 0xff;
      if (local_11c < 9) {
        local_110 = local_11c;
        if (uVar1 != 0) {
          local_110 = local_11c + 0x12;
        }
        BVar4 = (uint)""[local_11c] + (uint)uVar1;
        if (((*(byte *)((long)chip + 0x1c31) & 1) == 0) ||
           ((*(byte *)((long)chip + (long)(int)local_110 * 0xc0 + 0xb9) & 1) == 0)) {
          if ((val & 0x20) == 0) {
            disable_operator((op_type_conflict *)((long)chip + (long)(int)local_110 * 0xc0 + 8),1);
            disable_operator((op_type_conflict *)
                             ((long)chip + (long)(int)(local_110 + 9) * 0xc0 + 8),1);
            if (((*(byte *)((long)chip + 0x1c31) & 1) != 0) &&
               ((*(byte *)((long)chip + (long)(int)local_110 * 0xc0 + 0xb8) & 1) != 0)) {
              disable_operator((op_type_conflict *)
                               ((long)chip + (long)(int)(local_110 + 3) * 0xc0 + 8),1);
              disable_operator((op_type_conflict *)
                               ((long)chip + (long)(int)(local_110 + 0xc) * 0xc0 + 8),1);
            }
          }
          else {
            *(undefined1 *)((long)chip + 0x1b28) = 0;
            enable_operator((OPL_DATA_conflict *)chip,BVar4,
                            (op_type_conflict *)((long)chip + (long)(int)local_110 * 0xc0 + 8),1);
            enable_operator((OPL_DATA_conflict *)chip,BVar4 + 3,
                            (op_type_conflict *)((long)chip + (long)(int)(local_110 + 9) * 0xc0 + 8)
                            ,1);
            if (((*(byte *)((long)chip + 0x1c31) & 1) != 0) &&
               ((*(byte *)((long)chip + (long)(int)local_110 * 0xc0 + 0xb8) & 1) != 0)) {
              enable_operator((OPL_DATA_conflict *)chip,BVar4 + 8,
                              (op_type_conflict *)
                              ((long)chip + (long)(int)(local_110 + 3) * 0xc0 + 8),1);
              enable_operator((OPL_DATA_conflict *)chip,BVar4 + 0xb,
                              (op_type_conflict *)
                              ((long)chip + (long)(int)(local_110 + 0xc) * 0xc0 + 8),1);
            }
          }
          BVar5 = local_11c + uVar1;
          change_frequency((OPL_DATA_conflict *)chip,BVar5,BVar4,
                           (op_type_conflict *)((long)chip + (long)(int)local_110 * 0xc0 + 8));
          change_frequency((OPL_DATA_conflict *)chip,BVar5,BVar4 + 3,
                           (op_type_conflict *)((long)chip + (long)(int)(local_110 + 9) * 0xc0 + 8))
          ;
          if ((*(byte *)((long)chip + 0x1c31) & 1) != 0) {
            if (uVar1 != 0) {
              local_11c = local_11c + 0x12;
            }
            if ((*(byte *)((long)chip + (ulong)local_11c * 0xc0 + 0xb8) & 1) != 0) {
              change_frequency((OPL_DATA_conflict *)chip,BVar5,BVar4 + 8,
                               (op_type_conflict *)
                               ((long)chip + (long)(int)(local_110 + 3) * 0xc0 + 8));
              change_frequency((OPL_DATA_conflict *)chip,BVar5,BVar4 + 0xb,
                               (op_type_conflict *)
                               ((long)chip + (long)(int)(local_110 + 0xc) * 0xc0 + 8));
            }
          }
        }
      }
    }
  }
  else if (uVar2 == 0xc0) {
    uVar6 = idx - 0xc0 & 0xff;
    if (uVar6 < 9) {
      local_120 = uVar6;
      if (uVar1 != 0) {
        local_120 = uVar6 + 0x12;
      }
      change_feedback((OPL_DATA_conflict *)chip,uVar6 + uVar1,
                      (op_type_conflict *)((long)chip + (long)(int)local_120 * 0xc0 + 8));
      *(int *)((long)chip + (long)(int)local_120 * 0xc0 + 0xbc) = (int)(val & 0x10) >> 4;
      *(int *)((long)chip + (long)(int)local_120 * 0xc0 + 0xc0) = (int)(val & 0x20) >> 5;
      *(int *)((long)chip + (long)(int)local_120 * 0xc0 + 0xbc) =
           ((int)(val & 0x40) >> 6) + *(int *)((long)chip + (long)(int)local_120 * 0xc0 + 0xbc);
      *(int *)((long)chip + (long)(int)local_120 * 0xc0 + 0xc0) =
           ((int)(val & 0x80) >> 7) + *(int *)((long)chip + (long)(int)local_120 * 0xc0 + 0xc0);
    }
  }
  else if ((uVar2 == 0xe0) || (uVar2 == 0xf0)) {
    local_124 = idx - 0xe0 & 0xff;
    if (((idx & 7) < 6) && (local_124 < 0x16)) {
      if (uVar1 != 0) {
        local_124 = local_124 + 0x16;
      }
      if ((*(byte *)((long)chip + 0x1c31) & 1) == 0) {
        *(byte *)((long)chip + (long)(int)local_124 + 0x1d2c) = val & 3;
      }
      else {
        *(byte *)((long)chip + (long)(int)local_124 + 0x1d2c) = val & 7;
      }
      iVar8 = 9;
      if ((idx & 7) < 3) {
        iVar8 = 0;
      }
      change_waveform((OPL_DATA_conflict *)chip,local_124,
                      (op_type_conflict *)
                      ((long)chip + (long)(int)((uint)""[(int)local_124] + iVar8) * 0xc0 + 8));
    }
  }
  return;
}

Assistant:

static void adlib_write(void *chip, Bit16u idx, Bit8u val)
{
	OPL_DATA* OPL = (OPL_DATA*)chip;
	
	Bit16u second_set = idx&0x100;
	OPL->adlibreg[idx] = val;

	switch (idx&0xf0)
	{
	case ARC_CONTROL:
		// here we check for the second set registers, too:
		switch (idx)
		{
		case 0x02:	// timer1 counter
		case 0x03:	// timer2 counter
			break;
		case 0x04:
			// IRQ reset, timer mask/start
			if (val&0x80)
			{
				// clear IRQ bits in status register
				OPL->status &= ~0x60;
			}
			else
			{
				OPL->status = 0;
			}
			break;
#if defined(OPLTYPE_IS_OPL3)
		case 0x04|ARC_SECONDSET:
			// 4op enable/disable switches for each possible channel
			OPL->op[0].is_4op = (val&1)>0;
			OPL->op[3].is_4op_attached = OPL->op[0].is_4op;
			OPL->op[1].is_4op = (val&2)>0;
			OPL->op[4].is_4op_attached = OPL->op[1].is_4op;
			OPL->op[2].is_4op = (val&4)>0;
			OPL->op[5].is_4op_attached = OPL->op[2].is_4op;
			OPL->op[18].is_4op = (val&8)>0;
			OPL->op[21].is_4op_attached = OPL->op[18].is_4op;
			OPL->op[19].is_4op = (val&16)>0;
			OPL->op[22].is_4op_attached = OPL->op[19].is_4op;
			OPL->op[20].is_4op = (val&32)>0;
			OPL->op[23].is_4op_attached = OPL->op[20].is_4op;
			break;
		case 0x05|ARC_SECONDSET:
			break;
#endif
		case 0x08:
			// CSW, note select
			break;
		default:
			break;
		}
		break;
	case ARC_TVS_KSR_MUL:
	case ARC_TVS_KSR_MUL+0x10:
		{
		// tremolo/vibrato/sustain keeping enabled; key scale rate; frequency multiplication
		int num = idx&7;
		Bitu base = (idx-ARC_TVS_KSR_MUL)&0xff;
		if ((num<6) && (base<22)) {
			Bitu modop = regbase2modop[second_set?(base+22):base];
			Bitu regbase = base+second_set;
			Bitu chanbase = second_set?(modop-18+ARC_SECONDSET):modop;

			// change tremolo/vibrato and sustain keeping of this operator
			op_type* op_ptr = &OPL->op[modop+((num<3) ? 0 : 9)];
			change_keepsustain(OPL, regbase,op_ptr);
			change_vibrato(OPL, regbase,op_ptr);

			// change frequency calculations of this operator as
			// key scale rate and frequency multiplicator can be changed
#if defined(OPLTYPE_IS_OPL3)
			if ((OPL->adlibreg[0x105]&1) && (OPL->op[modop].is_4op_attached))
			{
				// operator uses frequency of channel
				change_frequency(OPL, chanbase-3,regbase,op_ptr);
			}
			else
			{
				change_frequency(OPL, chanbase,regbase,op_ptr);
			}
#else
			change_frequency(OPL, chanbase,base,op_ptr);
#endif
		}
		}
		break;
	case ARC_KSL_OUTLEV:
	case ARC_KSL_OUTLEV+0x10:
		{
		// key scale level; output rate
		int num = idx&7;
		Bitu base = (idx-ARC_KSL_OUTLEV)&0xff;
		if ((num<6) && (base<22))
		{
			Bitu modop = regbase2modop[second_set?(base+22):base];
			Bitu chanbase = second_set?(modop-18+ARC_SECONDSET):modop;

			// change frequency calculations of this operator as
			// key scale level and output rate can be changed
			op_type* op_ptr = &OPL->op[modop+((num<3) ? 0 : 9)];
#if defined(OPLTYPE_IS_OPL3)
			Bitu regbase = base+second_set;
			if ((OPL->adlibreg[0x105]&1) && (OPL->op[modop].is_4op_attached))
			{
				// operator uses frequency of channel
				change_frequency(OPL, chanbase-3,regbase,op_ptr);
			}
			else
			{
				change_frequency(OPL, chanbase,regbase,op_ptr);
			}
#else
			change_frequency(OPL, chanbase,base,op_ptr);
#endif
		}
		}
		break;
	case ARC_ATTR_DECR:
	case ARC_ATTR_DECR+0x10:
		{
		// attack/decay rates
		int num = idx&7;
		Bitu base = (idx-ARC_ATTR_DECR)&0xff;
		if ((num<6) && (base<22))
		{
			Bitu regbase = base+second_set;

			// change attack rate and decay rate of this operator
			op_type* op_ptr = &OPL->op[regbase2op[second_set?(base+22):base]];
			change_attackrate(OPL, regbase,op_ptr);
			change_decayrate(OPL, regbase,op_ptr);
		}
		}
		break;
	case ARC_SUSL_RELR:
	case ARC_SUSL_RELR+0x10:
		{
		// sustain level; release rate
		int num = idx&7;
		Bitu base = (idx-ARC_SUSL_RELR)&0xff;
		if ((num<6) && (base<22))
		{
			Bitu regbase = base+second_set;

			// change sustain level and release rate of this operator
			op_type* op_ptr = &OPL->op[regbase2op[second_set?(base+22):base]];
			change_releaserate(OPL, regbase,op_ptr);
			change_sustainlevel(OPL, regbase,op_ptr);
		}
		}
		break;
	case ARC_FREQ_NUM:
		{
		// 0xa0-0xa8 low8 frequency
		Bitu base = (idx-ARC_FREQ_NUM)&0xff;
		if (base<9)
		{
			Bits opbase = second_set?(base+18):base;
			Bits modbase;
			Bitu chanbase;
#if defined(OPLTYPE_IS_OPL3)
		if ((OPL->adlibreg[0x105]&1) && OPL->op[opbase].is_4op_attached) break;
#endif
			// regbase of modulator:
			modbase = modulatorbase[base]+second_set;

			chanbase = base+second_set;

			change_frequency(OPL, chanbase,modbase,&OPL->op[opbase]);
			change_frequency(OPL, chanbase,modbase+3,&OPL->op[opbase+9]);
#if defined(OPLTYPE_IS_OPL3)
			// for 4op channels all four operators are modified to the frequency of the channel
			if ((OPL->adlibreg[0x105]&1) && OPL->op[second_set?(base+18):base].is_4op)
			{
				change_frequency(OPL, chanbase,modbase+8,&OPL->op[opbase+3]);
				change_frequency(OPL, chanbase,modbase+3+8,&OPL->op[opbase+3+9]);
			}
#endif
		}
		}
		break;
	case ARC_KON_BNUM:
		{
		Bitu base;
		if (OPL->UpdateHandler != NULL)	// hack for DOSBox logs
			OPL->UpdateHandler(OPL->UpdateParam);
		if (idx == ARC_PERC_MODE)
		{
#if defined(OPLTYPE_IS_OPL3)
			if (second_set) return;
#endif

			if ((val & 0x20) && (val & 0x1F))
				OPL->isDisabled = 0x00;
			if ((val&0x30) == 0x30)
			{		// BassDrum active
				enable_operator(OPL, 16,&OPL->op[6],OP_ACT_PERC);
				change_frequency(OPL, 6,16,&OPL->op[6]);
				enable_operator(OPL, 16+3,&OPL->op[6+9],OP_ACT_PERC);
				change_frequency(OPL, 6,16+3,&OPL->op[6+9]);
			}
			else
			{
				disable_operator(&OPL->op[6],OP_ACT_PERC);
				disable_operator(&OPL->op[6+9],OP_ACT_PERC);
			}
			if ((val&0x28) == 0x28)
			{		// Snare active
				enable_operator(OPL, 17+3,&OPL->op[16],OP_ACT_PERC);
				change_frequency(OPL, 7,17+3,&OPL->op[16]);
			}
			else
			{
				disable_operator(&OPL->op[16],OP_ACT_PERC);
			}
			if ((val&0x24) == 0x24)
			{		// TomTom active
				enable_operator(OPL, 18,&OPL->op[8],OP_ACT_PERC);
				change_frequency(OPL, 8,18,&OPL->op[8]);
			}
			else
			{
				disable_operator(&OPL->op[8],OP_ACT_PERC);
			}
			if ((val&0x22) == 0x22)
			{		// Cymbal active
				enable_operator(OPL, 18+3,&OPL->op[8+9],OP_ACT_PERC);
				change_frequency(OPL, 8,18+3,&OPL->op[8+9]);
			}
			else
			{
				disable_operator(&OPL->op[8+9],OP_ACT_PERC);
			}
			if ((val&0x21) == 0x21)
			{		// Hihat active
				enable_operator(OPL, 17,&OPL->op[7],OP_ACT_PERC);
				change_frequency(OPL, 7,17,&OPL->op[7]);
			}
			else
			{
				disable_operator(&OPL->op[7],OP_ACT_PERC);
			}

			break;
		}
		// regular 0xb0-0xb8
		base = (idx-ARC_KON_BNUM)&0xff;
		if (base<9)
		{
			Bits opbase = second_set?(base+18):base;
			// regbase of modulator:
			Bits modbase = modulatorbase[base]+second_set;
			Bitu chanbase;

#if defined(OPLTYPE_IS_OPL3)
			if ((OPL->adlibreg[0x105]&1) && OPL->op[opbase].is_4op_attached) break;
#endif
			if (val&32)
			{
				OPL->isDisabled = 0x00;
				// operator switched on
				enable_operator(OPL, modbase,&OPL->op[opbase],OP_ACT_NORMAL);		// modulator (if 2op)
				enable_operator(OPL, modbase+3,&OPL->op[opbase+9],OP_ACT_NORMAL);	// carrier (if 2op)
#if defined(OPLTYPE_IS_OPL3)
				// for 4op channels all four operators are switched on
				if ((OPL->adlibreg[0x105]&1) && OPL->op[opbase].is_4op)
				{
					// turn on chan+3 operators as well
					enable_operator(OPL, modbase+8,&OPL->op[opbase+3],OP_ACT_NORMAL);
					enable_operator(OPL, modbase+3+8,&OPL->op[opbase+3+9],OP_ACT_NORMAL);
				}
#endif
			}
			else
			{
				// operator switched off
				disable_operator(&OPL->op[opbase],OP_ACT_NORMAL);
				disable_operator(&OPL->op[opbase+9],OP_ACT_NORMAL);
#if defined(OPLTYPE_IS_OPL3)
				// for 4op channels all four operators are switched off
				if ((OPL->adlibreg[0x105]&1) && OPL->op[opbase].is_4op)
				{
					// turn off chan+3 operators as well
					disable_operator(&OPL->op[opbase+3],OP_ACT_NORMAL);
					disable_operator(&OPL->op[opbase+3+9],OP_ACT_NORMAL);
				}
#endif
			}

			chanbase = base+second_set;

			// change frequency calculations of modulator and carrier (2op) as
			// the frequency of the channel has changed
			change_frequency(OPL, chanbase,modbase,&OPL->op[opbase]);
			change_frequency(OPL, chanbase,modbase+3,&OPL->op[opbase+9]);
#if defined(OPLTYPE_IS_OPL3)
			// for 4op channels all four operators are modified to the frequency of the channel
			if ((OPL->adlibreg[0x105]&1) && OPL->op[second_set?(base+18):base].is_4op)
			{
				// change frequency calculations of chan+3 operators as well
				change_frequency(OPL, chanbase,modbase+8,&OPL->op[opbase+3]);
				change_frequency(OPL, chanbase,modbase+3+8,&OPL->op[opbase+3+9]);
			}
#endif
		}
		}
		break;
	case ARC_FEEDBACK:
		{
		// 0xc0-0xc8 feedback/modulation type (AM/FM)
		Bitu base = (idx-ARC_FEEDBACK)&0xff;
		if (base<9)
		{
			Bits opbase = second_set?(base+18):base;
			Bitu chanbase = base+second_set;
			change_feedback(OPL, chanbase,&OPL->op[opbase]);
#if defined(OPLTYPE_IS_OPL3)
			// OPL3 panning
			OPL->op[opbase].left_pan = ((val&0x10)>>4);
			OPL->op[opbase].right_pan = ((val&0x20)>>5);
			OPL->op[opbase].left_pan += ((val&0x40)>>6);
			OPL->op[opbase].right_pan += ((val&0x80)>>7);
#endif
		}
		}
		break;
	case ARC_WAVE_SEL:
	case ARC_WAVE_SEL+0x10:
		{
		int num = idx&7;
		Bitu base = (idx-ARC_WAVE_SEL)&0xff;
		if ((num<6) && (base<22))
		{
#if defined(OPLTYPE_IS_OPL3)
			Bits wselbase = second_set?(base+22):base;	// for easier mapping onto wave_sel[]
			op_type* op_ptr;
			// change waveform
			if (OPL->adlibreg[0x105]&1) OPL->wave_sel[wselbase] = val&7;	// opl3 mode enabled, all waveforms accessible
			else OPL->wave_sel[wselbase] = val&3;
			op_ptr = &OPL->op[regbase2modop[wselbase]+((num<3) ? 0 : 9)];
			change_waveform(OPL, wselbase,op_ptr);
#else
			if (OPL->adlibreg[0x01]&0x20)
			{
				op_type* op_ptr;
				
				// wave selection enabled, change waveform
				OPL->wave_sel[base] = val&3;
				op_ptr = &OPL->op[regbase2modop[base]+((num<3) ? 0 : 9)];
				change_waveform(OPL, base,op_ptr);
			}
#endif
		}
		}
		break;
	default:
		break;
	}
}